

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolutil.cpp
# Opt level: O0

void * utm_alloc(UToolMemory *mem)

{
  int iVar1;
  UBool UVar2;
  int capacity;
  int32_t newIndex;
  int32_t oldIndex;
  char *p;
  UToolMemory *mem_local;
  
  _newIndex = (void *)0x0;
  iVar1 = mem->idx;
  capacity = iVar1 + 1;
  UVar2 = utm_hasCapacity(mem,capacity);
  if (UVar2 != '\0') {
    _newIndex = (void *)((long)mem->array + (long)(iVar1 * mem->size));
    mem->idx = capacity;
    memset(_newIndex,0,(long)mem->size);
  }
  return _newIndex;
}

Assistant:

U_CAPI void * U_EXPORT2
utm_alloc(UToolMemory *mem) {
    char *p=NULL;
    int32_t oldIndex=mem->idx;
    int32_t newIndex=oldIndex+1;
    if(utm_hasCapacity(mem, newIndex)) {
        p=(char *)mem->array+oldIndex*mem->size;
        mem->idx=newIndex;
        uprv_memset(p, 0, mem->size);
    }
    return p;
}